

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

QByteArray * parseHtmlMetaForEncoding(QByteArray *__return_storage_ptr__,QByteArrayView data)

{
  long lVar1;
  Data *pDVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  qsizetype qVar6;
  long pos;
  long lVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_90;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_90.ptr = data.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_90.d = (Data *)0x400;
  if ((long)data.m_size < 0x400) {
    local_90.d = (Data *)data.m_size;
  }
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArrayView::toByteArray((QByteArray *)&local_78,(QByteArrayView *)&local_90);
  QByteArray::toLower_helper((QByteArray *)&local_58,(QByteArray *)&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  qVar6 = QStaticByteArrayMatcher<6UL>::indexIn<void>
                    (&parseHtmlMetaForEncoding::metaSearcher,(QByteArray *)&local_58,0);
  if ((qVar6 != -1) &&
     (qVar6 = QStaticByteArrayMatcher<9UL>::indexIn<void>
                        (&parseHtmlMetaForEncoding::charsetSearcher,(QByteArray *)&local_58,qVar6),
     qVar6 != -1)) {
    pos = qVar6 + 8;
    if ((pos < local_58.size) && ((local_58.ptr[pos] == '\'' || (local_58.ptr[pos] == '\"')))) {
      pos = qVar6 + 9;
    }
    lVar7 = pos;
    while (lVar1 = lVar7 + 1, lVar1 < local_58.size) {
      lVar4 = lVar7 + 1;
      lVar7 = lVar1;
      if (((ulong)(byte)local_58.ptr[lVar4] < 0x3f) &&
         ((0x4000808400000000U >> ((ulong)(byte)local_58.ptr[lVar4] & 0x3f) & 1) != 0)) {
        (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::mid(__return_storage_ptr__,(QByteArray *)&local_58,pos,lVar1 - pos);
        qVar6 = QByteArray::indexOf(__return_storage_ptr__,':',0);
        if (0 < qVar6) {
          QByteArray::left((QByteArray *)&local_78,__return_storage_ptr__,qVar6);
          pDVar2 = (__return_storage_ptr__->d).d;
          pcVar3 = (__return_storage_ptr__->d).ptr;
          (__return_storage_ptr__->d).d = local_78.d;
          (__return_storage_ptr__->d).ptr = local_78.ptr;
          qVar6 = (__return_storage_ptr__->d).size;
          (__return_storage_ptr__->d).size = local_78.size;
          local_78.d = pDVar2;
          local_78.ptr = pcVar3;
          local_78.size = qVar6;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
        }
        QByteArray::simplified_helper((QByteArray *)&local_78,__return_storage_ptr__);
        pDVar2 = (__return_storage_ptr__->d).d;
        pcVar3 = (__return_storage_ptr__->d).ptr;
        (__return_storage_ptr__->d).d = local_78.d;
        (__return_storage_ptr__->d).ptr = local_78.ptr;
        qVar6 = (__return_storage_ptr__->d).size;
        (__return_storage_ptr__->d).size = local_78.size;
        local_78.d = pDVar2;
        local_78.ptr = pcVar3;
        local_78.size = qVar6;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
        local_78.d = (Data *)0x4f70a8;
        bVar5 = operator==(__return_storage_ptr__,(char **)&local_78);
        if (bVar5) {
          local_90.d = (Data *)0x0;
          local_90.ptr = (storage_type *)0x0;
          local_90.size = 0;
          local_78.d = (__return_storage_ptr__->d).d;
          local_78.ptr = (__return_storage_ptr__->d).ptr;
          (__return_storage_ptr__->d).d = (Data *)0x0;
          (__return_storage_ptr__->d).ptr = "UTF-8";
          local_78.size = (__return_storage_ptr__->d).size;
          (__return_storage_ptr__->d).size = 5;
          QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_90);
        }
        if ((__return_storage_ptr__->d).size != 0) goto LAB_00300435;
        QArrayDataPointer<char>::~QArrayDataPointer(&__return_storage_ptr__->d);
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_00300435:
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static QByteArray parseHtmlMetaForEncoding(QByteArrayView data)
{
    static constexpr auto metaSearcher = qMakeStaticByteArrayMatcher("meta ");
    static constexpr auto charsetSearcher = qMakeStaticByteArrayMatcher("charset=");

    QByteArray header = data.first(qMin(data.size(), qsizetype(1024))).toByteArray().toLower();
    qsizetype pos = metaSearcher.indexIn(header);
    if (pos != -1) {
        pos = charsetSearcher.indexIn(header, pos);
        if (pos != -1) {
            pos += qstrlen("charset=");
            if (pos < header.size() && (header.at(pos) == '\"' || header.at(pos) == '\''))
                ++pos;

            qsizetype pos2 = pos;
            // The attribute can be closed with either """, "'", ">" or "/",
            // none of which are valid charset characters.
            while (++pos2 < header.size()) {
                char ch = header.at(pos2);
                if (ch == '\"' || ch == '\'' || ch == '>' || ch == '/') {
                    QByteArray name = header.mid(pos, pos2 - pos);
                    qsizetype colon = name.indexOf(':');
                    if (colon > 0)
                        name = name.left(colon);
                    name = name.simplified();
                    if (name == "unicode") // QTBUG-41998, ICU will return UTF-16.
                        name = QByteArrayLiteral("UTF-8");
                    if (!name.isEmpty())
                        return name;
                }
            }
        }
    }
    return QByteArray();
}